

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  byte bVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  byte *pbVar2;
  size_type sVar3;
  char *pcVar4;
  byte *pbVar5;
  iterator iVar6;
  ostream *poVar7;
  mapped_type *this_02;
  undefined8 *puVar8;
  long *plVar9;
  size_type *psVar10;
  size_type sVar11;
  int iVar12;
  int iVar13;
  size_type sVar14;
  undefined8 uVar15;
  bool bVar16;
  StringPiece framework_name;
  StringPiece proto_file_list;
  StringPiece proto_file;
  string local_d0;
  string local_b0;
  ProtoFrameworkCollector *local_90;
  StringPiece local_88;
  char *local_78 [2];
  string local_68;
  StringPiece local_48;
  size_type local_38;
  
  local_88.length_ = (size_type)local_88.ptr_;
  sVar3 = stringpiece_internal::StringPiece::find(line,':',0);
  local_38 = (size_type)(int)sVar3;
  if (local_38 == 0xffffffffffffffff) {
    local_88.ptr_ = (char *)local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Framework/proto file mapping line without colon sign: \'","");
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_68,line);
    pcVar4 = (char *)0xf;
    if ((char **)local_88.ptr_ != local_78) {
      pcVar4 = local_78[0];
    }
    if (pcVar4 < (char *)(local_88.length_ + local_68._M_string_length)) {
      uVar15 = (char *)0xf;
      if ((StringPiece *)local_68._M_dataplus._M_p != (StringPiece *)&local_68.field_2) {
        uVar15 = local_68.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (char *)(local_88.length_ + local_68._M_string_length)) goto LAB_0027232d;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88.ptr_);
    }
    else {
LAB_0027232d:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_b0.field_2._M_allocated_capacity = *psVar10;
      local_b0.field_2._8_8_ = puVar8[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar10;
      local_b0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_b0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)psVar10 = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_d0.field_2._M_allocated_capacity = *psVar10;
      local_d0.field_2._8_8_ = plVar9[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar10;
      local_d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)out_error,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((StringPiece *)local_68._M_dataplus._M_p != (StringPiece *)&local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((char **)local_88.ptr_ != local_78) {
      operator_delete(local_88.ptr_);
    }
    goto LAB_0027243a;
  }
  local_90 = this;
  local_88 = stringpiece_internal::StringPiece::substr(line,0,local_38);
  sVar14 = local_88.length_;
  pbVar5 = (byte *)local_88.ptr_;
  local_68._0_16_ =
       stringpiece_internal::StringPiece::substr
                 (line,(long)((sVar3 << 0x20) + 0x100000000) >> 0x20,0xffffffffffffffff);
  if (sVar14 != 0) {
    sVar14 = sVar14 - 1;
    sVar3 = sVar14;
    pbVar2 = pbVar5;
    do {
      if ((4 < *pbVar2 - 9) && (*pbVar2 != 0x20)) {
        pbVar5 = pbVar5 + sVar14;
        goto LAB_00271f15;
      }
      local_88.length_ = sVar3;
      local_88.ptr_ = (char *)(pbVar2 + 1);
      bVar16 = sVar3 != 0;
      sVar3 = sVar3 - 1;
      pbVar2 = pbVar2 + 1;
    } while (bVar16);
  }
  goto LAB_00271f37;
  while( true ) {
    local_48.length_ = sVar3;
    bVar16 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar16) break;
LAB_00271ff2:
    pbVar5 = pbVar5 + -1;
    if ((4 < *pbVar5 - 9) && (*pbVar5 != 0x20)) {
      this_00 = &local_90->map_->_M_t;
      stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_d0,&local_48);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(this_00,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((_Rb_tree_header *)iVar6._M_node != &(local_90->map_->_M_t)._M_impl.super__Rb_tree_header)
      {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "warning: duplicate proto file reference, replacing framework entry for \'",0x48)
        ;
        stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_d0,&local_48);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                            local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' with \'",8);
        stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_b0,&local_88);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' (was \'",8);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)(iVar6._M_node + 2),(long)iVar6._M_node[2]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\').",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        std::ostream::flush();
      }
      sVar3 = stringpiece_internal::StringPiece::find(&local_48,' ',0);
      if (sVar3 != 0xffffffffffffffff) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                   ,0x66);
        stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_d0,&local_48);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                            local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        std::ostream::flush();
      }
      stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_d0,&local_88);
      this_01 = local_90->map_;
      stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_b0,&local_48);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,&local_b0);
      std::__cxx11::string::operator=((string *)this_02,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      break;
    }
  }
LAB_00272294:
  iVar13 = iVar12 + 1;
  sVar3 = (size_type)iVar13;
  if (local_68._M_string_length <= sVar3) goto LAB_0027243a;
  goto LAB_00271f5b;
  while( true ) {
    local_88.length_ = sVar3;
    pbVar5 = pbVar5 + -1;
    bVar16 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar16) break;
LAB_00271f15:
    if ((4 < *pbVar5 - 9) && (*pbVar5 != 0x20)) break;
  }
LAB_00271f37:
  if (local_68._M_string_length != 0) {
    sVar3 = 0;
    iVar13 = 0;
LAB_00271f5b:
    sVar14 = stringpiece_internal::StringPiece::find((StringPiece *)&local_68,',',sVar3);
    iVar12 = (int)sVar14;
    if ((int)sVar14 == -1) {
      iVar12 = (int)local_68._M_string_length;
    }
    local_48 = stringpiece_internal::StringPiece::substr
                         ((StringPiece *)&local_68,sVar3,(long)(iVar12 - iVar13));
    sVar11 = local_48.length_;
    pcVar4 = local_48.ptr_;
    sVar3 = sVar11;
    sVar14 = sVar11;
    while (sVar14 != 0) {
      sVar3 = sVar3 - 1;
      pbVar5 = (byte *)local_48.ptr_;
      bVar1 = *pbVar5;
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
        pbVar5 = (byte *)(pcVar4 + sVar11);
        goto LAB_00271ff2;
      }
      sVar14 = local_48.length_ - 1;
      local_48.length_ = sVar14;
      local_48.ptr_ = (char *)(pbVar5 + 1);
    }
    goto LAB_00272294;
  }
LAB_0027243a:
  return local_38 != 0xffffffffffffffff;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, std::string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        std::string("Framework/proto file mapping line without colon sign: '") +
        std::string(line) + "'.";
    return false;
  }
  StringPiece framework_name = line.substr(0, offset);
  StringPiece proto_file_list = line.substr(offset + 1);
  TrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file = proto_file_list.substr(start, offset - start);
    TrimWhitespace(&proto_file);
    if (!proto_file.empty()) {
      std::map<std::string, std::string>::iterator existing_entry =
          map_->find(std::string(proto_file));
      if (existing_entry != map_->end()) {
        std::cerr << "warning: duplicate proto file reference, replacing "
                     "framework entry for '"
                  << std::string(proto_file) << "' with '" << std::string(framework_name)
                  << "' (was '" << existing_entry->second << "')." << std::endl;
        std::cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        std::cerr << "note: framework mapping file had a proto file with a "
                     "space in, hopefully that isn't a missing comma: '"
                  << std::string(proto_file) << "'" << std::endl;
        std::cerr.flush();
      }

      (*map_)[std::string(proto_file)] = std::string(framework_name);
    }

    start = offset + 1;
  }

  return true;
}